

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NRooks.cpp
# Opt level: O2

void __thiscall pm::NRooks::generateSamples(NRooks *this)

{
  Random *this_00;
  uint p;
  uint uVar1;
  uint i;
  uint uVar2;
  float fVar3;
  float in_XMM0_Db;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  value_type local_70;
  float local_68;
  float fStack_64;
  ulong local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  
  this_00 = &(this->super_Sampler).rnd_;
  for (uVar1 = 0; uVar1 < (this->super_Sampler).numSets_; uVar1 = uVar1 + 1) {
    for (uVar2 = 0; uVar2 < (this->super_Sampler).numSamples_; uVar2 = uVar2 + 1) {
      local_48 = (float)uVar2;
      fStack_44 = in_XMM0_Db;
      local_68 = Random::real(this_00);
      local_58._0_4_ = (this->super_Sampler).numSamples_;
      local_58._4_4_ = (this->super_Sampler).numSets_;
      uStack_50 = *(undefined8 *)&(this->super_Sampler).field_0x14;
      fStack_64 = extraout_XMM0_Db;
      fVar3 = Random::real(this_00);
      auVar4._4_4_ = local_48 + fVar3;
      auVar4._0_4_ = local_48 + local_68;
      auVar4._8_4_ = fStack_44 + fStack_64;
      auVar4._12_4_ = fStack_44 + extraout_XMM0_Db_00;
      auVar6._0_8_ = local_58 & 0xffffffff;
      auVar6._8_4_ = (this->super_Sampler).numSamples_;
      auVar6._12_4_ = 0;
      auVar5._4_4_ = (float)(SUB168(auVar6 | _DAT_00113560,8) - DAT_00113560._8_8_);
      auVar5._0_4_ = (float)(SUB168(auVar6 | _DAT_00113560,0) - (double)DAT_00113560);
      auVar5._8_8_ = 0;
      auVar5 = divps(auVar4,auVar5);
      local_70 = auVar5._0_8_;
      std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::push_back
                (&(this->super_Sampler).samples_,&local_70);
      in_XMM0_Db = extraout_XMM0_Db_01;
    }
  }
  shuffleXCoords(this);
  shuffleYCoords(this);
  return;
}

Assistant:

void NRooks::generateSamples()
{
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < numSamples_; i++)
		{
			const Vector2 sp((i + rnd_.real()) / numSamples_, (i + rnd_.real()) / numSamples_);
			samples_.push_back(sp);
		}

	shuffleXCoords();
	shuffleYCoords();
}